

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage.cpp
# Opt level: O0

void do_mirror_data<unsigned_long_long>
               (QImageData *dst,QImageData *src,int dstX0,int dstY0,int dstXIncr,int dstYIncr,int w,
               int h)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int dstX_2;
  int srcX_2;
  unsigned_long_long *dstPtr_1;
  unsigned_long_long *srcPtr_2;
  int dstY_1;
  int srcY_2;
  int dstX_1;
  int srcX_1;
  unsigned_long_long *srcPtr_1;
  int srcXEnd2;
  int srcY_1;
  int dstX;
  int srcX;
  unsigned_long_long *dstPtr;
  unsigned_long_long *srcPtr;
  int dstY;
  int srcY;
  int srcYEnd;
  int srcXEnd;
  uint local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_48;
  int local_44;
  int local_30;
  int local_2c;
  
  if (in_RDI == in_RSI) {
    if ((in_EDX == 0) || (in_ECX != 0)) {
      local_84 = dstX_2;
    }
    else {
      local_84 = dstX_2 / 2;
    }
    if (in_ECX == 0) {
      local_88 = (uint)dstPtr_1;
    }
    else {
      local_88 = (int)(uint)dstPtr_1 / 2;
    }
    local_30 = in_ECX;
    for (local_2c = 0; local_2c < (int)local_88; local_2c = local_2c + 1) {
      lVar4 = *(long *)(in_RSI + 0x38);
      lVar1 = *(long *)(in_RSI + 0x48);
      lVar2 = *(long *)(in_RDI + 0x38);
      lVar3 = *(long *)(in_RDI + 0x48);
      local_48 = in_EDX;
      for (local_44 = 0; local_44 < local_84; local_44 = local_44 + 1) {
        std::swap<unsigned_long_long>
                  ((unsigned_long_long *)(lVar4 + local_2c * lVar1 + (long)local_44 * 8),
                   (unsigned_long_long *)(lVar2 + local_30 * lVar3 + (long)local_48 * 8));
        local_48 = in_R8D + local_48;
      }
      local_30 = in_R9D + local_30;
    }
    if (((in_EDX != 0) && (in_ECX != 0)) && (((uint)dstPtr_1 & 1) != 0)) {
      lVar4 = *(long *)(in_RSI + 0x38) + (long)((int)(uint)dstPtr_1 / 2) * *(long *)(in_RSI + 0x48);
      local_60 = in_EDX;
      for (local_5c = 0; local_5c < dstX_2 / 2; local_5c = local_5c + 1) {
        std::swap<unsigned_long_long>
                  ((unsigned_long_long *)(lVar4 + (long)local_5c * 8),
                   (unsigned_long_long *)(lVar4 + (long)local_60 * 8));
        local_60 = in_R8D + local_60;
      }
    }
  }
  else {
    local_68 = in_ECX;
    for (local_64 = 0; local_64 < (int)(uint)dstPtr_1; local_64 = local_64 + 1) {
      lVar4 = *(long *)(in_RSI + 0x38);
      lVar1 = *(long *)(in_RSI + 0x48);
      lVar2 = *(long *)(in_RDI + 0x38);
      lVar3 = *(long *)(in_RDI + 0x48);
      local_80 = in_EDX;
      for (local_7c = 0; local_7c < dstX_2; local_7c = local_7c + 1) {
        *(undefined8 *)(lVar2 + local_68 * lVar3 + (long)local_80 * 8) =
             *(undefined8 *)(lVar4 + local_64 * lVar1 + (long)local_7c * 8);
        local_80 = in_R8D + local_80;
      }
      local_68 = in_R9D + local_68;
    }
  }
  return;
}

Assistant:

inline void do_mirror_data(QImageData *dst, QImageData *src,
                                             int dstX0, int dstY0,
                                             int dstXIncr, int dstYIncr,
                                             int w, int h)
{
    if (dst == src) {
        // When mirroring in-place, stop in the middle for one of the directions, since we
        // are swapping the bytes instead of merely copying.
        const int srcXEnd = (dstX0 && !dstY0) ? w / 2 : w;
        const int srcYEnd = dstY0 ? h / 2 : h;
        for (int srcY = 0, dstY = dstY0; srcY < srcYEnd; ++srcY, dstY += dstYIncr) {
            T *srcPtr = (T *) (src->data + srcY * src->bytes_per_line);
            T *dstPtr = (T *) (dst->data + dstY * dst->bytes_per_line);
            for (int srcX = 0, dstX = dstX0; srcX < srcXEnd; ++srcX, dstX += dstXIncr)
                std::swap(srcPtr[srcX], dstPtr[dstX]);
        }
        // If mirroring both ways, the middle line needs to be mirrored horizontally only.
        if (dstX0 && dstY0 && (h & 1)) {
            int srcY = h / 2;
            int srcXEnd2 = w / 2;
            T *srcPtr = (T *) (src->data + srcY * src->bytes_per_line);
            for (int srcX = 0, dstX = dstX0; srcX < srcXEnd2; ++srcX, dstX += dstXIncr)
                std::swap(srcPtr[srcX], srcPtr[dstX]);
        }
    } else {
        for (int srcY = 0, dstY = dstY0; srcY < h; ++srcY, dstY += dstYIncr) {
            T *srcPtr = (T *) (src->data + srcY * src->bytes_per_line);
            T *dstPtr = (T *) (dst->data + dstY * dst->bytes_per_line);
            for (int srcX = 0, dstX = dstX0; srcX < w; ++srcX, dstX += dstXIncr)
                dstPtr[dstX] = srcPtr[srcX];
        }
    }
}